

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sws.c
# Opt level: O0

int get_request(curl_socket_t sock,httprequest *req)

{
  uint __errnum;
  bool bVar1;
  bool bVar2;
  int iVar3;
  uint *puVar4;
  char *pcVar5;
  size_t local_60;
  size_t local_48;
  size_t pipereq_length;
  char *pipereq;
  ssize_t sStack_30;
  int overflow;
  ssize_t got;
  char *reqbuf;
  int fail;
  int error;
  httprequest *req_local;
  curl_socket_t sock_local;
  
  bVar1 = false;
  sStack_30 = 0;
  bVar2 = false;
  pipereq_length = 0;
  local_48 = 0;
  if ((req->pipelining & 1U) != 0) {
    pipereq_length = (size_t)(req->reqbuf + req->checkindex);
    local_48 = req->offset - req->checkindex;
    req->pipelining = false;
    req->checkindex = 0;
    req->offset = 0;
  }
  if (req->offset < 149999) {
    if ((local_48 == 0) || (pipereq_length == 0)) {
      if (req->skip == 0) {
        sStack_30 = recv(sock,req->reqbuf + req->offset,149999 - req->offset,0);
      }
      else {
        sStack_30 = recv(sock,req->reqbuf + req->offset,req->cl,0);
      }
    }
    else {
      memmove(req,(void *)pipereq_length,local_48);
      sStack_30 = curlx_uztosz(local_48);
    }
    if (got_exit_signal != 0) {
      return -1;
    }
    if (sStack_30 == 0) {
      logmsg("Connection closed by client");
      bVar1 = true;
    }
    else if (sStack_30 < 0) {
      puVar4 = (uint *)__errno_location();
      __errnum = *puVar4;
      if ((__errnum == 0xb) || (__errnum == 0xb)) {
        return 0;
      }
      pcVar5 = strerror(__errnum);
      logmsg("recv() returned error: (%d) %s",(ulong)__errnum,pcVar5);
      bVar1 = true;
    }
    if (bVar1) {
      req->reqbuf[req->offset] = '\0';
      storerequest(req->reqbuf,req->offset);
      return -1;
    }
    logmsg("Read %zd bytes",sStack_30);
    req->offset = sStack_30 + req->offset;
    req->reqbuf[req->offset] = '\0';
    iVar3 = ProcessRequest(req);
    req->done_processing = iVar3;
    if (got_exit_signal != 0) {
      return -1;
    }
    if ((req->done_processing != 0) && (req->pipe != 0)) {
      logmsg("Waiting for another piped request");
      req->done_processing = 0;
      req->pipe = req->pipe + -1;
    }
  }
  else {
    bVar2 = true;
  }
  if ((bVar2) || ((req->offset == 149999 && (0 < sStack_30)))) {
    logmsg("Request would overflow buffer, closing connection");
    req->reqbuf[149999] = '\0';
    bVar1 = true;
  }
  else if (req->offset < 150000) {
    req->reqbuf[req->offset] = '\0';
  }
  else {
    logmsg("Request buffer overflow, closing connection");
    req->reqbuf[149999] = '\0';
    bVar1 = true;
  }
  if ((bVar1) || (req->done_processing != 0)) {
    if ((req->pipelining & 1U) == 0) {
      local_60 = req->offset;
    }
    else {
      local_60 = req->checkindex;
    }
    storerequest(req->reqbuf,local_60);
  }
  if (got_exit_signal == 0) {
    req_local._4_4_ = 1;
    if (bVar1) {
      req_local._4_4_ = -1;
    }
  }
  else {
    req_local._4_4_ = -1;
  }
  return req_local._4_4_;
}

Assistant:

static int get_request(curl_socket_t sock, struct httprequest *req)
{
  int error;
  int fail = 0;
  char *reqbuf = req->reqbuf;
  ssize_t got = 0;
  int overflow = 0;

  char *pipereq = NULL;
  size_t pipereq_length = 0;

  if(req->pipelining) {
    pipereq = reqbuf + req->checkindex;
    pipereq_length = req->offset - req->checkindex;

    /* Now that we've got the pipelining info we can reset the
       pipelining-related vars which were skipped in init_httprequest */
    req->pipelining = FALSE;
    req->checkindex = 0;
    req->offset = 0;
  }

  if(req->offset >= REQBUFSIZ-1) {
    /* buffer is already full; do nothing */
    overflow = 1;
  }
  else {
    if(pipereq_length && pipereq) {
      memmove(reqbuf, pipereq, pipereq_length);
      got = curlx_uztosz(pipereq_length);
      pipereq_length = 0;
    }
    else {
      if(req->skip)
        /* we are instructed to not read the entire thing, so we make sure to
           only read what we're supposed to and NOT read the enire thing the
           client wants to send! */
        got = sread(sock, reqbuf + req->offset, req->cl);
      else
        got = sread(sock, reqbuf + req->offset, REQBUFSIZ-1 - req->offset);
    }
    if(got_exit_signal)
      return -1;
    if(got == 0) {
      logmsg("Connection closed by client");
      fail = 1;
    }
    else if(got < 0) {
      error = SOCKERRNO;
      if(EAGAIN == error || EWOULDBLOCK == error) {
        /* nothing to read at the moment */
        return 0;
      }
      logmsg("recv() returned error: (%d) %s", error, strerror(error));
      fail = 1;
    }
    if(fail) {
      /* dump the request received so far to the external file */
      reqbuf[req->offset] = '\0';
      storerequest(reqbuf, req->offset);
      return -1;
    }

    logmsg("Read %zd bytes", got);

    req->offset += (size_t)got;
    reqbuf[req->offset] = '\0';

    req->done_processing = ProcessRequest(req);
    if(got_exit_signal)
      return -1;
    if(req->done_processing && req->pipe) {
      logmsg("Waiting for another piped request");
      req->done_processing = 0;
      req->pipe--;
    }
  }

  if(overflow || (req->offset == REQBUFSIZ-1 && got > 0)) {
    logmsg("Request would overflow buffer, closing connection");
    /* dump request received so far to external file anyway */
    reqbuf[REQBUFSIZ-1] = '\0';
    fail = 1;
  }
  else if(req->offset > REQBUFSIZ-1) {
    logmsg("Request buffer overflow, closing connection");
    /* dump request received so far to external file anyway */
    reqbuf[REQBUFSIZ-1] = '\0';
    fail = 1;
  }
  else
    reqbuf[req->offset] = '\0';

  /* at the end of a request dump it to an external file */
  if(fail || req->done_processing)
    storerequest(reqbuf, req->pipelining ? req->checkindex : req->offset);
  if(got_exit_signal)
    return -1;

  return fail ? -1 : 1;
}